

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowUp2_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  
  for (lVar4 = 0; (int)lVar4 < dst_width + -1; lVar4 = lVar4 + 2) {
    uVar1 = *(ushort *)((long)src_ptr + lVar4);
    uVar2 = *(ushort *)((long)src_ptr + lVar4 + 2);
    uVar3 = *(ushort *)((long)src_ptr + lVar4 + src_stride * 2);
    uVar5 = (uint)*(ushort *)((long)src_ptr + lVar4 + src_stride * 2 + 2);
    dst[lVar4] = (uint16_t)
                 ((uint)uVar1 + (uint)uVar1 * 8 + uVar5 + ((uint)uVar3 + (uint)uVar2) * 3 + 8 >> 4);
    dst[lVar4 + 1] =
         (uint16_t)((uVar5 + uVar1) * 3 + (uint)uVar2 + (uint)uVar2 * 8 + (uint)uVar3 + 8 >> 4);
  }
  if ((dst_width & 1U) != 0) {
    dst[lVar4] = (uint16_t)
                 (((uint)*(ushort *)((long)src_ptr + lVar4 + src_stride * 2) +
                  (uint)*(ushort *)((long)src_ptr + lVar4 + 2)) * 3 +
                  (uint)*(ushort *)((long)src_ptr + lVar4) +
                  (uint)*(ushort *)((long)src_ptr + lVar4) * 8 +
                  (uint)*(ushort *)((long)src_ptr + src_stride * 2 + lVar4 + 2) + 8 >> 4);
  }
  return;
}

Assistant:

void ScaleRowUp2_16_C(const uint16_t* src_ptr,
                      ptrdiff_t src_stride,
                      uint16_t* dst,
                      int dst_width) {
  const uint16_t* src2 = src_ptr + src_stride;

  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
    dst[1] = (p0 * 3 + p1 * 9 + p2 + p3 * 3 + 8) >> 4;
    ++src_ptr;
    ++src2;
    dst += 2;
  }
  if (dst_width & 1) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
  }
}